

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

void __thiscall ON_Matrix::SetDiagonal(ON_Matrix *this,double *d)

{
  uint uVar1;
  double **ppdVar2;
  uint uVar3;
  ulong uVar4;
  double ***pppdVar5;
  ulong uVar6;
  
  Zero(this);
  if (d != (double *)0x0) {
    uVar1 = this->m_row_count;
    pppdVar5 = &this->m;
    if (uVar1 == (this->m_rowmem).m_count) {
      pppdVar5 = &(this->m_rowmem).m_a;
    }
    ppdVar2 = *pppdVar5;
    uVar3 = this->m_col_count;
    if ((int)uVar1 < this->m_col_count) {
      uVar3 = uVar1;
    }
    uVar6 = 0;
    uVar4 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar4 = uVar6;
    }
    for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      ppdVar2[uVar6][uVar6] = d[uVar6];
    }
  }
  return;
}

Assistant:

void ON_Matrix::SetDiagonal( const double* d )
{
  Zero();
  if (d) 
  {
    double** this_m = ThisM();
    const int n = MinCount();
    int i;
    for ( i = 0; i < n; i++ )
    {
      this_m[i][i] = *d++;
    }
  }
}